

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

unsigned_long __thiscall
gmlc::utilities::numeric_conversion<unsigned_long>
          (utilities *this,string_view V,unsigned_long defValue)

{
  char *pcVar1;
  string_view V_00;
  
  pcVar1 = V._M_str;
  V_00._M_str = (byte *)V._M_len;
  if ((this != (utilities *)0x0) && (numCheck[*V_00._M_str] == '\x01')) {
    V_00._M_len = (size_t)this;
    pcVar1 = (char *)numConv<unsigned_long>(V_00);
  }
  return (unsigned_long)pcVar1;
}

Assistant:

X numeric_conversion(std::string_view V, const X defValue)
{
    if (nonNumericFirstCharacter(V)) {
        return defValue;
    }
    try {
        return numConv<X>(V);
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}